

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# painter.cpp
# Opt level: O0

void __thiscall Painter::~Painter(Painter *this)

{
  bool bVar1;
  ostream *poVar2;
  Painter *this_local;
  
  this->m_stopThread = true;
  bVar1 = std::thread::joinable(&this->m_draw_thread);
  if (bVar1) {
    std::thread::join();
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Deconstruct ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/roamiri[P]selfOrganizedNetwork/painter.cpp"
                          );
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::thread::~thread(&this->m_draw_thread);
  std::vector<std::shared_ptr<draw_object>,_std::allocator<std::shared_ptr<draw_object>_>_>::~vector
            (&this->m_objects);
  return;
}

Assistant:

Painter::~Painter()
{
	m_stopThread = true;
	if(m_draw_thread.joinable())
		m_draw_thread.join();
	std::cout << "Deconstruct " << __FILE__ << std::endl;
}